

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  int iVar1;
  Platform PVar2;
  Dim DVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  SPIRVariable *pSVar8;
  MSLConstexprSampler *pMVar9;
  SPIRCombinedImageSampler *pSVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  CompilerError *pCVar13;
  uint32_t uVar14;
  CompilerMSL *pCVar15;
  uint32_t uVar16;
  CompilerMSL *pCVar17;
  string *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  char cVar19;
  uint uVar20;
  uint32_t index;
  string local_320;
  CompilerMSL *local_300;
  string *local_2f8;
  string offset_expr;
  string local_2d0;
  SPIRType *local_2b0;
  uint local_2a8;
  uint32_t local_2a4;
  string tex_coords;
  uint32_t local_27c;
  uint32_t local_26c;
  uint32_t local_268;
  byte local_264;
  string coord_expr;
  size_type *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  bool *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar16 = (args->base).img.id;
  local_2b0 = (args->base).imgtype;
  local_26c = args->lod;
  local_27c = args->grad_x;
  local_2a4 = args->grad_y;
  local_268 = args->bias;
  local_300 = this;
  local_1f8 = p_forward;
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,uVar16);
  pCVar15 = local_300;
  local_2f8 = __return_storage_ptr__;
  if (pSVar8 == (SPIRVariable *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    local_240 = &__return_storage_ptr__->_M_string_length;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0029e31e:
    bVar5 = true;
    pMVar9 = (MSLConstexprSampler *)0x0;
LAB_0029e323:
    if (((local_300->msl_options).swizzle_texture_samples == true) &&
       ((args->base).is_gather == true)) {
      pSVar10 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                          ((Compiler *)local_300,uVar16);
      uVar14 = uVar16;
      if (pSVar10 != (SPIRCombinedImageSampler *)0x0) {
        uVar14 = (pSVar10->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&coord_expr,&local_300->super_CompilerGLSL,uVar14,true)
      ;
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&coord_expr);
    }
LAB_0029e38f:
    if ((args->base).is_fetch == false) {
      if (*local_240 != 0) {
        ::std::__cxx11::string::append((char *)local_2f8);
      }
      to_sampler_expression_abi_cxx11_(&coord_expr,local_300,uVar16);
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&coord_expr);
    }
    pCVar15 = local_300;
    if ((((bVar5) || (pMVar9->ycbcr_conversion_enable == false)) &&
        ((local_300->msl_options).swizzle_texture_samples == true)) &&
       ((args->base).is_gather == true)) {
      to_swizzle_expression_abi_cxx11_(&tex_coords,local_300,uVar16);
      ::std::operator+(&coord_expr,", ",&tex_coords);
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&coord_expr);
      ::std::__cxx11::string::~string((string *)&tex_coords);
      pCVar15->used_swizzle_buffer = true;
    }
    if ((args->component == 0) || ((pCVar15->msl_options).swizzle_texture_samples != true)) {
      bVar4 = 0;
      goto LAB_0029e51e;
    }
    bVar5 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,args->component);
    to_component_argument_abi_cxx11_(&tex_coords,local_300,args->component);
    ::std::operator+(&coord_expr,", ",&tex_coords);
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&coord_expr);
    ::std::__cxx11::string::~string((string *)&tex_coords);
    local_264 = 0;
    bVar6 = false;
    pCVar15 = local_300;
    bVar4 = 0;
    if (bVar5) goto LAB_0029e51e;
  }
  else {
    uVar14 = (pSVar8->basevariable).id;
    if (uVar14 == 0) {
      uVar14 = (pSVar8->super_IVariant).self.id;
    }
    pMVar9 = find_constexpr_sampler(local_300,uVar14);
    bVar5 = Compiler::has_extended_decoration
                      ((Compiler *)pCVar15,(pSVar8->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
    (local_2f8->_M_dataplus)._M_p = (pointer)&local_2f8->field_2;
    local_2f8->_M_string_length = 0;
    local_240 = &local_2f8->_M_string_length;
    (local_2f8->field_2)._M_local_buf[0] = '\0';
    if (!bVar5) {
      if (pMVar9 == (MSLConstexprSampler *)0x0) goto LAB_0029e31e;
      if (pMVar9->ycbcr_conversion_enable != true) {
        bVar5 = false;
        goto LAB_0029e323;
      }
      if (1 < pMVar9->planes) {
        CompilerGLSL::to_expression_abi_cxx11_(&coord_expr,&pCVar15->super_CompilerGLSL,uVar16,true)
        ;
        ::std::__cxx11::string::append((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)&coord_expr);
        psVar18 = &local_300->plane_name_suffix;
        uVar20 = 1;
        while( true ) {
          offset_expr._M_dataplus._M_p._0_4_ = uVar20;
          if (pMVar9->planes <= uVar20) break;
          CompilerGLSL::to_expression_abi_cxx11_
                    (&tex_coords,&local_300->super_CompilerGLSL,uVar16,true);
          in_R8 = &offset_expr;
          join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                    (&coord_expr,(spirv_cross *)0x31b6f8,(char (*) [3])&tex_coords,psVar18,
                     &offset_expr,in_R9);
          ::std::__cxx11::string::append((string *)local_2f8);
          ::std::__cxx11::string::~string((string *)&coord_expr);
          ::std::__cxx11::string::~string((string *)&tex_coords);
          uVar20 = (uint)offset_expr._M_dataplus._M_p + 1;
        }
      }
      bVar5 = false;
      goto LAB_0029e38f;
    }
    bVar4 = 1;
LAB_0029e51e:
    local_264 = bVar4;
    bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,args->coord);
  }
  pCVar15 = local_300;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_
            (&coord_expr,&local_300->super_CompilerGLSL,args->coord,true);
  pSVar11 = Compiler::expression_type((Compiler *)pCVar15,args->coord);
  iVar1 = *(int *)&(pSVar11->super_IVariant).field_0xc;
  ::std::__cxx11::string::string((string *)&tex_coords,(string *)&coord_expr);
  uVar20 = iVar1 - 0xc;
  cVar19 = '\0';
  uVar14 = 3;
  index = 0;
  local_2a8 = uVar20;
  switch((local_2b0->image).dim) {
  case Dim1D:
    if (1 < pSVar11->vecsize) {
      CompilerGLSL::enclose_expression(&local_320,&pCVar15->super_CompilerGLSL,&tex_coords);
      ::std::operator+(&offset_expr,&local_320,".x");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      pCVar15 = local_300;
    }
    if ((args->base).is_fetch == true) {
      pCVar15 = (CompilerMSL *)&tex_coords;
      ::std::__cxx11::string::string((string *)&local_50,(string *)pCVar15);
      round_fp_tex_coords(&local_2d0,pCVar15,&local_50,uVar20 < 3);
      ::std::operator+(&local_320,"uint(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_50;
LAB_0029ec36:
      ::std::__cxx11::string::~string((string *)psVar18);
      pCVar15 = local_300;
    }
    else if ((*(uint *)&(pSVar11->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&offset_expr,pCVar15,&tex_coords,1);
      psVar18 = &offset_expr;
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)psVar18);
      goto LAB_0029ec36;
    }
    if ((pCVar15->msl_options).texture_1D_as_2D == true) {
      if ((args->base).is_fetch == true) {
        ::std::operator+(&local_320,"uint2(",&tex_coords);
        ::std::operator+(&offset_expr,&local_320,", 0)");
      }
      else {
        ::std::operator+(&local_320,"float2(",&tex_coords);
        ::std::operator+(&offset_expr,&local_320,", 0.5)");
      }
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      psVar18 = &local_320;
      goto LAB_0029edf8;
    }
LAB_0029ed99:
    cVar19 = '\0';
    index = 1;
    break;
  case Dim2D:
    if (2 < pSVar11->vecsize) {
      CompilerGLSL::enclose_expression(&local_320,&pCVar15->super_CompilerGLSL,&tex_coords);
      ::std::operator+(&offset_expr,&local_320,".xy");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      pCVar15 = local_300;
    }
    if ((args->base).is_fetch != true) {
      if ((*(uint *)&(pSVar11->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
        uVar14 = 2;
        convert_to_f32(&offset_expr,pCVar15,&tex_coords,2);
LAB_0029ecc2:
        psVar18 = &offset_expr;
        ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)psVar18);
        goto LAB_0029ecda;
      }
      goto LAB_0029e7fb;
    }
    pCVar15 = (CompilerMSL *)&tex_coords;
    ::std::__cxx11::string::string((string *)&local_d0,(string *)pCVar15);
    round_fp_tex_coords(&local_2d0,pCVar15,&local_d0,uVar20 < 3);
    ::std::operator+(&local_320,"uint2(",&local_2d0);
    ::std::operator+(&offset_expr,&local_320,")");
    ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    cVar19 = '\0';
    pCVar15 = local_300;
    index = 2;
    break;
  case Dim3D:
    if (3 < pSVar11->vecsize) {
      CompilerGLSL::enclose_expression(&local_320,&pCVar15->super_CompilerGLSL,&tex_coords);
      ::std::operator+(&offset_expr,&local_320,".xyz");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      pCVar15 = local_300;
    }
    if ((args->base).is_fetch == true) {
      pCVar15 = (CompilerMSL *)&tex_coords;
      ::std::__cxx11::string::string((string *)&local_f0,(string *)pCVar15);
      round_fp_tex_coords(&local_2d0,pCVar15,&local_f0,uVar20 < 3);
      ::std::operator+(&local_320,"uint3(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_f0;
LAB_0029ecda:
      ::std::__cxx11::string::~string((string *)psVar18);
      cVar19 = '\0';
      pCVar15 = local_300;
      index = uVar14;
    }
    else {
      if ((*(uint *)&(pSVar11->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
        uVar14 = 3;
        convert_to_f32(&offset_expr,pCVar15,&tex_coords,3);
        goto LAB_0029ecc2;
      }
      cVar19 = '\0';
      index = uVar14;
    }
    break;
  case DimCube:
    cVar19 = (args->base).is_fetch;
    if ((bool)cVar19 == true) {
      ::std::__cxx11::string::append((char *)&tex_coords);
      pCVar15 = (CompilerMSL *)&tex_coords;
      ::std::__cxx11::string::string((string *)&local_110,(string *)pCVar15);
      round_fp_tex_coords(&local_2d0,pCVar15,&local_110,local_2a8 < 3);
      ::std::operator+(&local_320,"uint2(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_110;
LAB_0029eb5c:
      ::std::__cxx11::string::~string((string *)psVar18);
      pCVar15 = local_300;
    }
    else if (3 < pSVar11->vecsize) {
      CompilerGLSL::enclose_expression(&local_320,&pCVar15->super_CompilerGLSL,&tex_coords);
      ::std::operator+(&offset_expr,&local_320,".xyz");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      psVar18 = &local_320;
      goto LAB_0029eb5c;
    }
    index = uVar14;
    if ((*(uint *)&(pSVar11->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&offset_expr,pCVar15,&tex_coords,3);
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      pCVar15 = local_300;
      index = 3;
    }
    break;
  case DimBuffer:
    if (1 < pSVar11->vecsize) {
      CompilerGLSL::enclose_expression(&local_320,&pCVar15->super_CompilerGLSL,&tex_coords);
      ::std::operator+(&offset_expr,&local_320,".x");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      pCVar15 = local_300;
    }
    if ((pCVar15->msl_options).texture_buffer_native == true) {
      pCVar15 = (CompilerMSL *)&tex_coords;
      ::std::__cxx11::string::string((string *)&local_70,(string *)pCVar15);
      round_fp_tex_coords(&local_2d0,pCVar15,&local_70,uVar20 < 3);
      ::std::operator+(&local_320,"uint(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_70;
    }
    else {
      if ((args->base).is_fetch != true) goto LAB_0029ed99;
      if ((pCVar15->msl_options).texel_buffer_texture_width == 0) {
        pCVar17 = (CompilerMSL *)&tex_coords;
        ::std::__cxx11::string::string((string *)&local_b0,(string *)pCVar17);
        round_fp_tex_coords(&local_218,pCVar17,&local_b0,uVar20 < 3);
        ::std::operator+(&local_238,"spvTexelBufferCoord(",&local_218);
        ::std::operator+(&local_2d0,&local_238,", ");
        uVar14 = 1;
        CompilerGLSL::to_expression_abi_cxx11_(&local_1f0,&pCVar15->super_CompilerGLSL,uVar16,true);
        ::std::operator+(&local_320,&local_2d0,&local_1f0);
        ::std::operator+(&offset_expr,&local_320,")");
        ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_2d0);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::__cxx11::string::~string((string *)&local_218);
        psVar18 = &local_b0;
        goto LAB_0029ecda;
      }
      pCVar15 = (CompilerMSL *)&tex_coords;
      ::std::__cxx11::string::string((string *)&local_90,(string *)pCVar15);
      round_fp_tex_coords(&local_2d0,pCVar15,&local_90,uVar20 < 3);
      ::std::operator+(&local_320,"spvTexelBufferCoord(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::operator=((string *)&tex_coords,(string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_90;
    }
LAB_0029edf8:
    ::std::__cxx11::string::~string((string *)psVar18);
    cVar19 = '\0';
    pCVar15 = local_300;
    index = 1;
    break;
  case DimSubpassData:
    ::std::__cxx11::string::assign((char *)&tex_coords);
LAB_0029e7fb:
    cVar19 = '\0';
    index = 2;
  }
  if ((args->base).is_fetch == true) {
    uVar16 = args->offset;
    if (uVar16 == 0) {
      uVar16 = args->coffset;
      if (uVar16 == 0) goto LAB_0029ef9c;
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
        uVar16 = args->coffset;
      }
      pSVar12 = Compiler::expression_type((Compiler *)pCVar15,uVar16);
      if (*(int *)&(pSVar12->super_IVariant).field_0xc == 8) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_320,&pCVar15->super_CompilerGLSL,args->coffset,true);
        ::std::operator+(&offset_expr," + ",&local_320);
        ::std::__cxx11::string::append((string *)&tex_coords);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_320,&pCVar15->super_CompilerGLSL,UInt,args->coffset);
        ::std::operator+(&offset_expr," + ",&local_320);
        ::std::__cxx11::string::append((string *)&tex_coords);
      }
    }
    else {
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
        uVar16 = args->offset;
      }
      pSVar12 = Compiler::expression_type((Compiler *)pCVar15,uVar16);
      if (*(int *)&(pSVar12->super_IVariant).field_0xc == 8) {
        CompilerGLSL::to_enclosed_expression_abi_cxx11_
                  (&local_320,&pCVar15->super_CompilerGLSL,args->offset,true);
        ::std::operator+(&offset_expr," + ",&local_320);
        ::std::__cxx11::string::append((string *)&tex_coords);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_
                  (&local_320,&pCVar15->super_CompilerGLSL,UInt,args->offset);
        ::std::operator+(&offset_expr," + ",&local_320);
        ::std::__cxx11::string::append((string *)&tex_coords);
      }
    }
    ::std::__cxx11::string::~string((string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&local_320);
  }
LAB_0029ef9c:
  if ((args->base).is_proj == true) {
    if ((*(uint *)&(pSVar11->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_2d0,&pCVar15->super_CompilerGLSL,args->coord,index);
      convert_to_f32(&local_320,pCVar15,&local_2d0,1);
      ::std::operator+(&offset_expr," / ",&local_320);
      ::std::__cxx11::string::append((string *)&tex_coords);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      psVar18 = &local_2d0;
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_320,&pCVar15->super_CompilerGLSL,args->coord,index);
      ::std::operator+(&offset_expr," / ",&local_320);
      ::std::__cxx11::string::append((string *)&tex_coords);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      psVar18 = &local_320;
    }
    ::std::__cxx11::string::~string((string *)psVar18);
  }
  if (*local_240 != 0) {
    ::std::__cxx11::string::append((char *)local_2f8);
  }
  if ((((local_2b0->image).dim == DimCube) && ((local_2b0->image).arrayed == true)) &&
     ((pCVar15->msl_options).emulate_cube_array == true)) {
    ::std::operator+(&local_320,"spvCubemapTo2DArrayFace(",&tex_coords);
    ::std::operator+(&offset_expr,&local_320,").xy");
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&local_320);
    if (cVar19 == '\0') {
      ::std::operator+(&local_238,", uint(spvCubemapTo2DArrayFace(",&tex_coords);
      ::std::operator+(&local_2d0,&local_238,").z) + (uint(");
      uVar20 = local_2a8;
      pCVar17 = pCVar15;
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_130,&pCVar15->super_CompilerGLSL,args->coord,index);
      round_fp_tex_coords(&local_218,pCVar17,&local_130,uVar20 < 3);
      ::std::operator+(&local_320,&local_2d0,&local_218);
      ::std::operator+(&offset_expr,&local_320,") * 6u)");
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::__cxx11::string::~string((string *)&local_2d0);
      psVar18 = &local_238;
    }
    else {
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_2d0,&pCVar15->super_CompilerGLSL,args->coord,2);
      ::std::operator+(&local_320,", uint(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      psVar18 = &local_2d0;
    }
    ::std::__cxx11::string::~string((string *)psVar18);
    add_spv_func_and_recompile(pCVar15,SPVFuncImplCubemapTo2DArrayFace);
  }
  else {
    ::std::__cxx11::string::append((string *)local_2f8);
    uVar20 = local_2a8;
    if (cVar19 != '\0') {
      if ((local_2b0->image).arrayed == true) {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_2d0,&pCVar15->super_CompilerGLSL,args->coord,2);
        ::std::operator+(&local_320,", uint(",&local_2d0);
        ::std::operator+(&offset_expr,&local_320,") % 6u");
        ::std::__cxx11::string::append((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&local_320);
        psVar18 = &local_2d0;
      }
      else {
        pCVar17 = pCVar15;
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_150,&pCVar15->super_CompilerGLSL,args->coord,2);
        round_fp_tex_coords(&local_2d0,pCVar17,&local_150,uVar20 < 3);
        ::std::operator+(&local_320,", uint(",&local_2d0);
        ::std::operator+(&offset_expr,&local_320,")");
        ::std::__cxx11::string::append((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_2d0);
        psVar18 = &local_150;
      }
      ::std::__cxx11::string::~string((string *)psVar18);
    }
    DVar3 = (local_2b0->image).dim;
    if ((local_2b0->image).arrayed == true) {
      if ((DVar3 == DimCube) && ((args->base).is_fetch == true)) {
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_2d0,&pCVar15->super_CompilerGLSL,args->coord,2);
        ::std::operator+(&local_320,", uint(",&local_2d0);
        ::std::operator+(&offset_expr,&local_320,") / 6u");
        ::std::__cxx11::string::append((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_2d0);
      }
      else {
        pCVar17 = pCVar15;
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&local_170,&pCVar15->super_CompilerGLSL,args->coord,index);
        round_fp_tex_coords(&local_2d0,pCVar17,&local_170,uVar20 < 3);
        ::std::operator+(&local_320,", uint(",&local_2d0);
        ::std::operator+(&offset_expr,&local_320,")");
        ::std::__cxx11::string::append((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)&offset_expr);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_2d0);
        ::std::__cxx11::string::~string((string *)&local_170);
        if (((local_2b0->image).dim == DimSubpassData) &&
           (((pCVar15->msl_options).multiview != false ||
            ((pCVar15->msl_options).arrayed_subpass_input != false)))) goto LAB_0029f485;
      }
    }
    else if ((DVar3 == DimSubpassData) &&
            (((pCVar15->msl_options).multiview != false ||
             ((pCVar15->msl_options).arrayed_subpass_input == true)))) {
LAB_0029f485:
      ::std::__cxx11::string::append((char *)local_2f8);
    }
  }
  if (args->dref != 0) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,args->dref);
    }
    ::std::__cxx11::string::append((char *)local_2f8);
    pSVar12 = Compiler::expression_type((Compiler *)pCVar15,args->dref);
    offset_expr._M_dataplus._M_p = (pointer)&offset_expr.field_2;
    offset_expr._M_string_length = 0;
    offset_expr.field_2._M_local_buf[0] = '\0';
    if ((args->base).is_proj == true) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                (&local_2d0,&pCVar15->super_CompilerGLSL,args->dref,true);
      CompilerGLSL::to_extract_component_expression_abi_cxx11_
                (&local_238,&pCVar15->super_CompilerGLSL,args->coord,index);
      join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                (&local_320,(spirv_cross *)&local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30fb0f,
                 (char (*) [4])&local_238,in_R8);
      ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_238);
      psVar18 = &local_2d0;
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_
                (&local_320,&pCVar15->super_CompilerGLSL,args->dref,true);
      psVar18 = &local_320;
      ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)psVar18);
    }
    ::std::__cxx11::string::~string((string *)psVar18);
    if ((*(uint *)&(pSVar12->super_IVariant).field_0xc & 0xfffffffd) == 0xc) {
      convert_to_f32(&local_320,local_300,&offset_expr,1);
      ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_320);
    }
    pCVar15 = local_300;
    ::std::__cxx11::string::append((string *)local_2f8);
    if ((pCVar15->msl_options).platform == macOS) {
      bVar5 = true;
      if (local_27c != 0 || local_2a4 != 0) {
        bVar7 = true;
        bVar5 = true;
        if (local_27c != 0) {
          bVar5 = CompilerGLSL::expression_is_constant_null
                            (&local_300->super_CompilerGLSL,local_27c);
        }
        if (local_2a4 != 0) {
          bVar7 = CompilerGLSL::expression_is_constant_null
                            (&local_300->super_CompilerGLSL,local_2a4);
        }
        if ((bVar5 & bVar7) != 1) {
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_320,
                     "Using non-constant 0.0 gradient() qualifier for sample_compare. This is not supported in MSL macOS."
                     ,(allocator *)&local_2d0);
          CompilerError::CompilerError(pCVar13,&local_320);
          __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::append((char *)local_2f8);
        bVar5 = (local_300->msl_options).platform == macOS;
        local_26c = 0;
        pCVar15 = local_300;
      }
      if ((bool)(local_268 != 0 & bVar5)) {
        bVar5 = CompilerGLSL::expression_is_constant_null(&pCVar15->super_CompilerGLSL,local_268);
        if (!bVar5) {
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_320,
                     "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS."
                     ,(allocator *)&local_2d0);
          CompilerError::CompilerError(pCVar13,&local_320);
          __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_27c = 0;
        local_2a4 = 0;
        local_268 = 0;
      }
      else {
        local_27c = 0;
        local_2a4 = 0;
      }
    }
    ::std::__cxx11::string::~string((string *)&offset_expr);
  }
  if ((local_268 != 0) &&
     (((local_2b0->image).dim != Dim1D || ((pCVar15->msl_options).texture_1D_as_2D == true)))) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,local_268);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_2d0,&pCVar15->super_CompilerGLSL,local_268,true);
    ::std::operator+(&local_320,", bias(",&local_2d0);
    ::std::operator+(&offset_expr,&local_320,")");
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_2d0);
  }
  if (local_26c == 0) {
    if ((((args->base).is_fetch == true) && (DVar3 = (local_2b0->image).dim, DVar3 != DimBuffer)) &&
       (((DVar3 != Dim1D || ((pCVar15->msl_options).texture_1D_as_2D == true)) &&
        (((local_2b0->image).ms == false && ((local_2b0->image).sampled != 2)))))) {
      ::std::__cxx11::string::append((char *)local_2f8);
    }
  }
  else if (((local_2b0->image).dim != Dim1D) || ((pCVar15->msl_options).texture_1D_as_2D == true)) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,local_26c);
    }
    if ((args->base).is_fetch == true) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_320,&pCVar15->super_CompilerGLSL,local_26c,true)
      ;
      ::std::operator+(&offset_expr,", ",&local_320);
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      psVar18 = &local_320;
    }
    else {
      CompilerGLSL::to_expression_abi_cxx11_(&local_2d0,&pCVar15->super_CompilerGLSL,local_26c,true)
      ;
      ::std::operator+(&local_320,", level(",&local_2d0);
      ::std::operator+(&offset_expr,&local_320,")");
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&offset_expr);
      ::std::__cxx11::string::~string((string *)&local_320);
      psVar18 = &local_2d0;
    }
    ::std::__cxx11::string::~string((string *)psVar18);
  }
  if ((local_27c != 0 || local_2a4 != 0) &&
     (((local_2b0->image).dim != Dim1D || ((pCVar15->msl_options).texture_1D_as_2D == true)))) {
    if ((bVar6 == false) ||
       (bVar5 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,local_27c), !bVar5)) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,local_2a4);
    }
    offset_expr._M_dataplus._M_p = (pointer)&offset_expr.field_2;
    offset_expr._M_string_length = 0;
    offset_expr.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::assign((char *)&offset_expr);
    ::std::operator+(&local_190,", gradient",&offset_expr);
    ::std::operator+(&local_1f0,&local_190,"(");
    CompilerGLSL::to_expression_abi_cxx11_(&local_1b0,&pCVar15->super_CompilerGLSL,local_27c,true);
    ::std::operator+(&local_218,&local_1f0,&local_1b0);
    ::std::operator+(&local_238,&local_218,", ");
    CompilerGLSL::to_expression_abi_cxx11_(&local_1d0,&pCVar15->super_CompilerGLSL,local_2a4,true);
    ::std::operator+(&local_2d0,&local_238,&local_1d0);
    ::std::operator+(&local_320,&local_2d0,")");
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::__cxx11::string::~string((string *)&offset_expr);
  }
  uVar16 = args->min_lod;
  if (uVar16 != 0) {
    PVar2 = (pCVar15->msl_options).platform;
    if (PVar2 == macOS) {
      if ((pCVar15->msl_options).msl_version < 0x4ee8) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&offset_expr,
                   "min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.",
                   (allocator *)&local_320);
        CompilerError::CompilerError(pCVar13,&offset_expr);
        __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if (PVar2 == iOS) {
      pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&offset_expr,"min_lod_clamp() is not supported on iOS.",
                 (allocator *)&local_320);
      CompilerError::CompilerError(pCVar13,&offset_expr);
      __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
      uVar16 = args->min_lod;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_2d0,&pCVar15->super_CompilerGLSL,uVar16,true);
    ::std::operator+(&local_320,", min_lod_clamp(",&local_2d0);
    ::std::operator+(&offset_expr,&local_320,")");
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&offset_expr);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_2d0);
  }
  offset_expr._M_dataplus._M_p = (pointer)&offset_expr.field_2;
  offset_expr._M_string_length = 0;
  offset_expr.field_2._M_local_buf[0] = '\0';
  uVar16 = args->coffset;
  if ((uVar16 == 0) || ((args->base).is_fetch != false)) {
    uVar16 = args->offset;
    if ((uVar16 != 0) && ((args->base).is_fetch == false)) {
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
        uVar16 = args->offset;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_320,&pCVar15->super_CompilerGLSL,uVar16,true);
      goto LAB_0029fd99;
    }
  }
  else {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
      uVar16 = args->coffset;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_320,&pCVar15->super_CompilerGLSL,uVar16,true);
LAB_0029fd99:
    ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_320);
    pCVar15 = local_300;
  }
  if (offset_expr._M_string_length != 0) {
    DVar3 = (local_2b0->image).dim;
    if (DVar3 == Dim3D) {
      if (3 < pSVar11->vecsize) {
        CompilerGLSL::enclose_expression(&local_2d0,&pCVar15->super_CompilerGLSL,&offset_expr);
        ::std::operator+(&local_320,&local_2d0,".xyz");
        ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_2d0);
        pCVar15 = local_300;
      }
      ::std::operator+(&local_320,", ",&offset_expr);
      ::std::__cxx11::string::append((string *)local_2f8);
    }
    else {
      if (DVar3 != Dim2D) goto LAB_0029fef8;
      if (2 < pSVar11->vecsize) {
        CompilerGLSL::enclose_expression(&local_2d0,&pCVar15->super_CompilerGLSL,&offset_expr);
        ::std::operator+(&local_320,&local_2d0,".xy");
        ::std::__cxx11::string::operator=((string *)&offset_expr,(string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_320);
        ::std::__cxx11::string::~string((string *)&local_2d0);
        pCVar15 = local_300;
      }
      ::std::operator+(&local_320,", ",&offset_expr);
      ::std::__cxx11::string::append((string *)local_2f8);
    }
    ::std::__cxx11::string::~string((string *)&local_320);
  }
LAB_0029fef8:
  if (args->component != 0) {
    if (((local_2b0->image).dim == Dim2D) && (offset_expr._M_string_length == 0)) {
      ::std::__cxx11::string::append((char *)local_2f8);
    }
    if ((byte)(local_264 | (pCVar15->msl_options).swizzle_texture_samples ^ 1U) == 1) {
      uVar16 = args->component;
      if (bVar6 == false) {
        bVar6 = false;
      }
      else {
        bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,uVar16);
        uVar16 = args->component;
      }
      to_component_argument_abi_cxx11_(&local_2d0,pCVar15,uVar16);
      ::std::operator+(&local_320,", ",&local_2d0);
      ::std::__cxx11::string::append((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)&local_2d0);
    }
  }
  if (args->sample != 0) {
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      bVar6 = CompilerGLSL::should_forward(&pCVar15->super_CompilerGLSL,args->sample);
    }
    ::std::__cxx11::string::append((char *)local_2f8);
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_320,&pCVar15->super_CompilerGLSL,args->sample,true);
    ::std::__cxx11::string::append((string *)local_2f8);
    ::std::__cxx11::string::~string((string *)&local_320);
  }
  *local_1f8 = bVar6;
  ::std::__cxx11::string::~string((string *)&offset_expr);
  ::std::__cxx11::string::~string((string *)&tex_coords);
  ::std::__cxx11::string::~string((string *)&coord_expr);
  return local_2f8;
}

Assistant:

string CompilerMSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;
	uint32_t lod = args.lod;
	uint32_t grad_x = args.grad_x;
	uint32_t grad_y = args.grad_y;
	uint32_t bias = args.bias;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	string farg_str;
	bool forward = true;

	if (!is_dynamic_img_sampler)
	{
		// Texture reference (for some cases)
		if (needs_chroma_reconstruction(constexpr_sampler))
		{
			// Multiplanar images need two or three textures.
			farg_str += to_expression(img);
			for (uint32_t i = 1; i < constexpr_sampler->planes; i++)
				farg_str += join(", ", to_expression(img), plane_name_suffix, i);
		}
		else if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		         msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			auto *combined = maybe_get<SPIRCombinedImageSampler>(img);
			farg_str += to_expression(combined ? combined->image : img);
		}

		// Sampler reference
		if (!args.base.is_fetch)
		{
			if (!farg_str.empty())
				farg_str += ", ";
			farg_str += to_sampler_expression(img);
		}

		if ((!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable) &&
		    msl_options.swizzle_texture_samples && args.base.is_gather)
		{
			// Add the swizzle constant from the swizzle buffer.
			farg_str += ", " + to_swizzle_expression(img);
			used_swizzle_buffer = true;
		}

		// Swizzled gather puts the component before the other args, to allow template
		// deduction to work.
		if (args.component && msl_options.swizzle_texture_samples)
		{
			forward = should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	// Texture coordinates
	forward = forward && should_forward(args.coord);
	auto coord_expr = to_enclosed_expression(args.coord);
	auto &coord_type = expression_type(args.coord);
	bool coord_is_fp = type_is_floating_point(coord_type);
	bool is_cube_fetch = false;

	string tex_coords = coord_expr;
	uint32_t alt_coord_component = 0;

	switch (imgtype.image.dim)
	{

	case Dim1D:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (args.base.is_fetch)
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 1);

		if (msl_options.texture_1D_as_2D)
		{
			if (args.base.is_fetch)
				tex_coords = "uint2(" + tex_coords + ", 0)";
			else
				tex_coords = "float2(" + tex_coords + ", 0.5)";
		}

		alt_coord_component = 1;
		break;

	case DimBuffer:
		if (coord_type.vecsize > 1)
			tex_coords = enclose_expression(tex_coords) + ".x";

		if (msl_options.texture_buffer_native)
		{
			tex_coords = "uint(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			// Metal texel buffer textures are 2D, so convert 1D coord to 2D.
			// Support for Metal 2.1's new texture_buffer type.
			if (args.base.is_fetch)
			{
				if (msl_options.texel_buffer_texture_width > 0)
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
				}
				else
				{
					tex_coords = "spvTexelBufferCoord(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ", " +
					             to_expression(img) + ")";
				}
			}
		}

		alt_coord_component = 1;
		break;

	case DimSubpassData:
		// If we're using Metal's native frame-buffer fetch API for subpass inputs,
		// this path will not be hit.
		tex_coords = "uint2(gl_FragCoord.xy)";
		alt_coord_component = 2;
		break;

	case Dim2D:
		if (coord_type.vecsize > 2)
			tex_coords = enclose_expression(tex_coords) + ".xy";

		if (args.base.is_fetch)
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 2);

		alt_coord_component = 2;
		break;

	case Dim3D:
		if (coord_type.vecsize > 3)
			tex_coords = enclose_expression(tex_coords) + ".xyz";

		if (args.base.is_fetch)
			tex_coords = "uint3(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		else if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	case DimCube:
		if (args.base.is_fetch)
		{
			is_cube_fetch = true;
			tex_coords += ".xy";
			tex_coords = "uint2(" + round_fp_tex_coords(tex_coords, coord_is_fp) + ")";
		}
		else
		{
			if (coord_type.vecsize > 3)
				tex_coords = enclose_expression(tex_coords) + ".xyz";
		}

		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords = convert_to_f32(tex_coords, 3);

		alt_coord_component = 3;
		break;

	default:
		break;
	}

	if (args.base.is_fetch && args.offset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.offset);
		auto &type = expression_type(args.offset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.offset);
		else
			tex_coords += " + " + to_enclosed_expression(args.offset);
	}
	else if (args.base.is_fetch && args.coffset)
	{
		// Fetch offsets must be applied directly to the coordinate.
		forward = forward && should_forward(args.coffset);
		auto &type = expression_type(args.coffset);
		if (type.basetype != SPIRType::UInt)
			tex_coords += " + " + bitcast_expression(SPIRType::UInt, args.coffset);
		else
			tex_coords += " + " + to_enclosed_expression(args.coffset);
	}

	// If projection, use alt coord as divisor
	if (args.base.is_proj)
	{
		if (sampling_type_needs_f32_conversion(coord_type))
			tex_coords += " / " + convert_to_f32(to_extract_component_expression(args.coord, alt_coord_component), 1);
		else
			tex_coords += " / " + to_extract_component_expression(args.coord, alt_coord_component);
	}

	if (!farg_str.empty())
		farg_str += ", ";

	if (imgtype.image.dim == DimCube && imgtype.image.arrayed && msl_options.emulate_cube_array)
	{
		farg_str += "spvCubemapTo2DArrayFace(" + tex_coords + ").xy";

		if (is_cube_fetch)
			farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ")";
		else
			farg_str +=
			    ", uint(spvCubemapTo2DArrayFace(" + tex_coords + ").z) + (uint(" +
			    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
			    ") * 6u)";

		add_spv_func_and_recompile(SPVFuncImplCubemapTo2DArrayFace);
	}
	else
	{
		farg_str += tex_coords;

		// If fetch from cube, add face explicitly
		if (is_cube_fetch)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.arrayed)
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") % 6u";
			else
				farg_str +=
				    ", uint(" + round_fp_tex_coords(to_extract_component_expression(args.coord, 2), coord_is_fp) + ")";
		}

		// If array, use alt coord
		if (imgtype.image.arrayed)
		{
			// Special case for cube arrays, face and layer are packed in one dimension.
			if (imgtype.image.dim == DimCube && args.base.is_fetch)
			{
				farg_str += ", uint(" + to_extract_component_expression(args.coord, 2) + ") / 6u";
			}
			else
			{
				farg_str +=
				    ", uint(" +
				    round_fp_tex_coords(to_extract_component_expression(args.coord, alt_coord_component), coord_is_fp) +
				    ")";
				if (imgtype.image.dim == DimSubpassData)
				{
					if (msl_options.multiview)
						farg_str += " + gl_ViewIndex";
					else if (msl_options.arrayed_subpass_input)
						farg_str += " + gl_Layer";
				}
			}
		}
		else if (imgtype.image.dim == DimSubpassData)
		{
			if (msl_options.multiview)
				farg_str += ", gl_ViewIndex";
			else if (msl_options.arrayed_subpass_input)
				farg_str += ", gl_Layer";
		}
	}

	// Depth compare reference value
	if (args.dref)
	{
		forward = forward && should_forward(args.dref);
		farg_str += ", ";

		auto &dref_type = expression_type(args.dref);

		string dref_expr;
		if (args.base.is_proj)
			dref_expr = join(to_enclosed_expression(args.dref), " / ",
			                 to_extract_component_expression(args.coord, alt_coord_component));
		else
			dref_expr = to_expression(args.dref);

		if (sampling_type_needs_f32_conversion(dref_type))
			dref_expr = convert_to_f32(dref_expr, 1);

		farg_str += dref_expr;

		if (msl_options.is_macos() && (grad_x || grad_y))
		{
			// For sample compare, MSL does not support gradient2d for all targets (only iOS apparently according to docs).
			// However, the most common case here is to have a constant gradient of 0, as that is the only way to express
			// LOD == 0 in GLSL with sampler2DArrayShadow (cascaded shadow mapping).
			// We will detect a compile-time constant 0 value for gradient and promote that to level(0) on MSL.
			bool constant_zero_x = !grad_x || expression_is_constant_null(grad_x);
			bool constant_zero_y = !grad_y || expression_is_constant_null(grad_y);
			if (constant_zero_x && constant_zero_y)
			{
				lod = 0;
				grad_x = 0;
				grad_y = 0;
				farg_str += ", level(0)";
			}
			else
			{
				SPIRV_CROSS_THROW("Using non-constant 0.0 gradient() qualifier for sample_compare. This is not "
				                  "supported in MSL macOS.");
			}
		}

		if (msl_options.is_macos() && bias)
		{
			// Bias is not supported either on macOS with sample_compare.
			// Verify it is compile-time zero, and drop the argument.
			if (expression_is_constant_null(bias))
			{
				bias = 0;
			}
			else
			{
				SPIRV_CROSS_THROW(
				    "Using non-constant 0.0 bias() qualifier for sample_compare. This is not supported in MSL macOS.");
			}
		}
	}

	// LOD Options
	// Metal does not support LOD for 1D textures.
	if (bias && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(bias);
		farg_str += ", bias(" + to_expression(bias) + ")";
	}

	// Metal does not support LOD for 1D textures.
	if (lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(lod);
		if (args.base.is_fetch)
		{
			farg_str += ", " + to_expression(lod);
		}
		else
		{
			farg_str += ", level(" + to_expression(lod) + ")";
		}
	}
	else if (args.base.is_fetch && !lod && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D) &&
	         imgtype.image.dim != DimBuffer && !imgtype.image.ms && imgtype.image.sampled != 2)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		// Check for sampled type as well, because is_fetch is also used for OpImageRead in MSL.
		farg_str += ", 0";
	}

	// Metal does not support LOD for 1D textures.
	if ((grad_x || grad_y) && (imgtype.image.dim != Dim1D || msl_options.texture_1D_as_2D))
	{
		forward = forward && should_forward(grad_x);
		forward = forward && should_forward(grad_y);
		string grad_opt;
		switch (imgtype.image.dim)
		{
		case Dim2D:
			grad_opt = "2d";
			break;
		case Dim3D:
			grad_opt = "3d";
			break;
		case DimCube:
			if (imgtype.image.arrayed && msl_options.emulate_cube_array)
				grad_opt = "2d";
			else
				grad_opt = "cube";
			break;
		default:
			grad_opt = "unsupported_gradient_dimension";
			break;
		}
		farg_str += ", gradient" + grad_opt + "(" + to_expression(grad_x) + ", " + to_expression(grad_y) + ")";
	}

	if (args.min_lod)
	{
		if (msl_options.is_macos())
		{
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("min_lod_clamp() is only supported in MSL 2.2+ and up on macOS.");
		}
		else if (msl_options.is_ios())
			SPIRV_CROSS_THROW("min_lod_clamp() is not supported on iOS.");

		forward = forward && should_forward(args.min_lod);
		farg_str += ", min_lod_clamp(" + to_expression(args.min_lod) + ")";
	}

	// Add offsets
	string offset_expr;
	if (args.coffset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.coffset);
		offset_expr = to_expression(args.coffset);
	}
	else if (args.offset && !args.base.is_fetch)
	{
		forward = forward && should_forward(args.offset);
		offset_expr = to_expression(args.offset);
	}

	if (!offset_expr.empty())
	{
		switch (imgtype.image.dim)
		{
		case Dim2D:
			if (coord_type.vecsize > 2)
				offset_expr = enclose_expression(offset_expr) + ".xy";

			farg_str += ", " + offset_expr;
			break;

		case Dim3D:
			if (coord_type.vecsize > 3)
				offset_expr = enclose_expression(offset_expr) + ".xyz";

			farg_str += ", " + offset_expr;
			break;

		default:
			break;
		}
	}

	if (args.component)
	{
		// If 2D has gather component, ensure it also has an offset arg
		if (imgtype.image.dim == Dim2D && offset_expr.empty())
			farg_str += ", int2(0)";

		if (!msl_options.swizzle_texture_samples || is_dynamic_img_sampler)
		{
			forward = forward && should_forward(args.component);
			farg_str += ", " + to_component_argument(args.component);
		}
	}

	if (args.sample)
	{
		forward = forward && should_forward(args.sample);
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	*p_forward = forward;

	return farg_str;
}